

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerConfig.cpp
# Opt level: O0

RayTracerConfig * RayTracerConfig::fromPlyFile(RayTracerConfig *__return_storage_ptr__,string *path)

{
  pointer *ppRVar1;
  byte bVar2;
  bool bVar3;
  invalid_argument *piVar4;
  istream *piVar5;
  void *pvVar6;
  ostream *this;
  reference pvVar7;
  reference pvVar8;
  size_type sVar9;
  reference pvVar10;
  Vector VVar11;
  Triangle local_400;
  Triangle local_3c0;
  int local_380;
  int local_37c;
  int v3;
  int v2;
  int v1;
  int count;
  int i_1;
  int j;
  string sss;
  value_type local_346;
  value_type local_343;
  uint8_t local_340 [4];
  uint8_t local_33c [4];
  int b;
  int g;
  int r;
  Vector v;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300 [39];
  byte local_2d9;
  undefined1 local_2d8 [7];
  bool isRGB;
  vector<RGB,_std::allocator<RGB>_> colors;
  vector<Point,_std::allocator<Point>_> vertices;
  int local_2a0;
  int faceCount;
  int vertexCount;
  string local_278 [8];
  string token;
  string local_250 [48];
  istream local_220 [8];
  ifstream file;
  string *path_local;
  RayTracerConfig *config;
  
  std::ifstream::ifstream(local_220,path,8);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((char *)local_250,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Unable to open file: ");
    std::invalid_argument::invalid_argument(piVar4,local_250);
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  RayTracerConfig(__return_storage_ptr__);
  std::__cxx11::string::string(local_278);
  std::operator>>(local_220,local_278);
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_278,"ply");
  if (!bVar3) {
    std::operator>>(local_220,local_278);
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_278,"format");
    if (bVar3) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar4,"Missing \'format\' specifier.");
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_278);
    local_2a0 = 0;
    vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    std::vector<Point,_std::allocator<Point>_>::vector
              ((vector<Point,_std::allocator<Point>_> *)
               &colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    std::vector<RGB,_std::allocator<RGB>_>::vector((vector<RGB,_std::allocator<RGB>_> *)local_2d8);
    local_2d9 = 0;
    do {
      piVar5 = std::operator>>(local_220,local_278);
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar3) {
        std::vector<RGB,_std::allocator<RGB>_>::~vector
                  ((vector<RGB,_std::allocator<RGB>_> *)local_2d8);
        std::vector<Point,_std::allocator<Point>_>::~vector
                  ((vector<Point,_std::allocator<Point>_> *)
                   &colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string(local_278);
        std::ifstream::~ifstream(local_220);
        return __return_storage_ptr__;
      }
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_278,"comment");
      if (bVar3) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_278);
      }
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_278,"element");
      if (bVar3) {
        std::operator>>(local_220,local_278);
        std::istream::operator>>(local_220,&local_2a0);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_278,"vertex");
        if (bVar3) {
          std::operator>>(local_220,local_278);
          while (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_278,"property"), bVar3) {
            std::operator>>(local_220,local_278);
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_278,"uchar");
            if (bVar3) {
              local_2d9 = 1;
            }
            std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_278);
            std::operator>>(local_220,local_278);
          }
        }
        std::operator>>(local_220,local_278);
        std::istream::operator>>
                  (local_220,
                   (int *)((long)&vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage + 4));
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_278,"face");
        if (!bVar3) {
          v.z._3_1_ = 1;
          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::operator+((char *)&i,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Unknown element \'");
          std::operator+(local_300,(char *)&i);
          std::invalid_argument::invalid_argument(piVar4,(string *)local_300);
          v.z._3_1_ = 0;
          __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        std::operator>>(local_220,local_278);
        while (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_278,"property"), bVar3) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_278);
          std::operator>>(local_220,local_278);
        }
      }
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_278,"end_header");
      if (bVar3) {
        for (v.y = 0.0; (int)v.y < local_2a0; v.y = (float)((int)v.y + 1)) {
          pvVar6 = (void *)std::istream::operator>>(local_220,(float *)&g);
          pvVar6 = (void *)std::istream::operator>>(pvVar6,(float *)&r);
          std::istream::operator>>(pvVar6,&v.x);
          std::vector<Point,_std::allocator<Point>_>::push_back
                    ((vector<Point,_std::allocator<Point>_> *)
                     &colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(value_type *)&g);
          if ((local_2d9 & 1) == 0) {
            local_346.r = 'd';
            local_346.g = 'd';
            local_346.b = 'd';
            std::vector<RGB,_std::allocator<RGB>_>::push_back
                      ((vector<RGB,_std::allocator<RGB>_> *)local_2d8,&local_346);
          }
          else {
            pvVar6 = (void *)std::istream::operator>>(local_220,&b);
            pvVar6 = (void *)std::istream::operator>>(pvVar6,(int *)local_33c);
            std::istream::operator>>(pvVar6,(int *)local_340);
            local_343.r = (uint8_t)b;
            local_343.g = local_33c[0];
            local_343.b = local_340[0];
            std::vector<RGB,_std::allocator<RGB>_>::push_back
                      ((vector<RGB,_std::allocator<RGB>_> *)local_2d8,&local_343);
          }
          std::__cxx11::string::string((string *)&i_1);
          for (count = 0; count < 0xb; count = count + 1) {
            std::operator>>(local_220,(string *)&i_1);
          }
          std::__cxx11::string::~string((string *)&i_1);
        }
        for (v1 = 0; v1 < vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_; v1 = v1 + 1) {
          std::istream::operator>>(local_220,&v2);
          if (v2 == 3) {
            pvVar6 = (void *)std::istream::operator>>(local_220,&v3);
            pvVar6 = (void *)std::istream::operator>>(pvVar6,&local_37c);
            std::istream::operator>>(pvVar6,&local_380);
            bVar3 = std::vector<RGB,_std::allocator<RGB>_>::empty
                              ((vector<RGB,_std::allocator<RGB>_> *)local_2d8);
            if (bVar3) {
              ppRVar1 = &colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
              pvVar7 = std::vector<Point,_std::allocator<Point>_>::operator[]
                                 ((vector<Point,_std::allocator<Point>_> *)ppRVar1,(long)v3);
              local_3c0.x.z = pvVar7->z;
              local_3c0.x.x = pvVar7->x;
              local_3c0.x.y = pvVar7->y;
              pvVar7 = std::vector<Point,_std::allocator<Point>_>::operator[]
                                 ((vector<Point,_std::allocator<Point>_> *)ppRVar1,(long)local_37c);
              local_3c0.y.z = pvVar7->z;
              local_3c0.y.x = pvVar7->x;
              local_3c0.y.y = pvVar7->y;
              pvVar7 = std::vector<Point,_std::allocator<Point>_>::operator[]
                                 ((vector<Point,_std::allocator<Point>_> *)ppRVar1,(long)local_380);
              local_3c0.z.z = pvVar7->z;
              local_3c0.z.x = pvVar7->x;
              local_3c0.z.y = pvVar7->y;
              local_3c0.colorX.r = '(';
              local_3c0.colorX.g = 200;
              local_3c0.colorX.b = '(';
              local_3c0.colorY.r = '2';
              local_3c0.colorY.g = '2';
              local_3c0.colorY.b = 200;
              local_3c0.colorZ.r = '\0';
              local_3c0.colorZ.g = '\0';
              local_3c0.colorZ.b = '\0';
              local_3c0.normal.x = 0.0;
              local_3c0.normal.y = 0.0;
              local_3c0.normal.z = 0.0;
              local_3c0.reflectionCoefficient = 0.1;
              std::vector<Triangle,_std::allocator<Triangle>_>::emplace_back<Triangle>
                        (&__return_storage_ptr__->triangles,&local_3c0);
            }
            else {
              ppRVar1 = &colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
              pvVar7 = std::vector<Point,_std::allocator<Point>_>::operator[]
                                 ((vector<Point,_std::allocator<Point>_> *)ppRVar1,(long)v3);
              local_400.x.z = pvVar7->z;
              local_400.x.x = pvVar7->x;
              local_400.x.y = pvVar7->y;
              pvVar7 = std::vector<Point,_std::allocator<Point>_>::operator[]
                                 ((vector<Point,_std::allocator<Point>_> *)ppRVar1,(long)local_37c);
              local_400.y.z = pvVar7->z;
              local_400.y.x = pvVar7->x;
              local_400.y.y = pvVar7->y;
              pvVar7 = std::vector<Point,_std::allocator<Point>_>::operator[]
                                 ((vector<Point,_std::allocator<Point>_> *)ppRVar1,(long)local_380);
              local_400.z.z = pvVar7->z;
              local_400.z.x = pvVar7->x;
              local_400.z.y = pvVar7->y;
              pvVar8 = std::vector<RGB,_std::allocator<RGB>_>::operator[]
                                 ((vector<RGB,_std::allocator<RGB>_> *)local_2d8,(long)v3);
              local_400.colorX.b = pvVar8->b;
              local_400.colorX.r = pvVar8->r;
              local_400.colorX.g = pvVar8->g;
              pvVar8 = std::vector<RGB,_std::allocator<RGB>_>::operator[]
                                 ((vector<RGB,_std::allocator<RGB>_> *)local_2d8,(long)local_37c);
              local_400.colorY.b = pvVar8->b;
              local_400.colorY.r = pvVar8->r;
              local_400.colorY.g = pvVar8->g;
              pvVar8 = std::vector<RGB,_std::allocator<RGB>_>::operator[]
                                 ((vector<RGB,_std::allocator<RGB>_> *)local_2d8,(long)local_380);
              local_400.colorZ.b = pvVar8->b;
              local_400.colorZ.r = pvVar8->r;
              local_400.colorZ.g = pvVar8->g;
              local_400.normal.x = 0.0;
              local_400.normal.y = 0.0;
              local_400.normal.z = 0.0;
              local_400.reflectionCoefficient = 0.1;
              std::vector<Triangle,_std::allocator<Triangle>_>::emplace_back<Triangle>
                        (&__return_storage_ptr__->triangles,&local_400);
            }
            sVar9 = std::vector<Triangle,_std::allocator<Triangle>_>::size
                              (&__return_storage_ptr__->triangles);
            pvVar10 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                                (&__return_storage_ptr__->triangles,sVar9 - 1);
            VVar11 = getNormalVector(pvVar10);
            sVar9 = std::vector<Triangle,_std::allocator<Triangle>_>::size
                              (&__return_storage_ptr__->triangles);
            pvVar10 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                                (&__return_storage_ptr__->triangles,sVar9 - 1);
            (pvVar10->normal).x = (float)(int)VVar11._0_8_;
            (pvVar10->normal).y = (float)(int)((ulong)VVar11._0_8_ >> 0x20);
            (pvVar10->normal).z = VVar11.z;
          }
          else {
            this = std::operator<<((ostream *)&std::cerr,"Warning: only triangles are supported");
            std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
            std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_278);
          }
        }
      }
      bVar2 = std::ios::good();
    } while ((bVar2 & 1) != 0);
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Invalid config file format.");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  faceCount._3_1_ = 1;
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+((char *)&vertexCount,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Not a .ply file: ");
  std::invalid_argument::invalid_argument(piVar4,(string *)&vertexCount);
  faceCount._3_1_ = 0;
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

RayTracerConfig RayTracerConfig::fromPlyFile(std::string const& path)
{
  std::ifstream file(path);
  if (!file.is_open())
    throw std::invalid_argument("Unable to open file: " + path);

  RayTracerConfig config;
  std::string token;
  file >> token;
  if (token != "ply")
    throw std::invalid_argument("Not a .ply file: " + path);
  file >> token;
  if (token != "format")
    throw std::invalid_argument("Missing 'format' specifier.");
  std::getline(file, token);

  int vertexCount = 0;
  int faceCount = 0;

  std::vector<Vector> vertices;
  std::vector<RGB> colors;
  bool isRGB = false;
  while (file >> token)
  {
    if (token == "comment")
      std::getline(file, token);
    if (token == "element")
    {
      file >> token;
      file >> vertexCount;
      if (token == "vertex")
      {
        // assume format x y z, ignore other
        file >> token;
        while (token == "property")
        {
          file >> token;
          if (token == "uchar")
            isRGB = true;

          std::getline(file, token);
          file >> token;
        }
      }
      file >> token;
      file >> faceCount;
      if (token == "face")
      {
        // assume property list uchar int vertex_indices
        file >> token;
        while (token == "property")
        {
          std::getline(file, token);
          file >> token;
        }
      }
      else
        throw std::invalid_argument("Unknown element '" + token
                                    + "', only 'vertex' and 'face' are supported");
    }
    if (token == "end_header")
    {
      for (int i = 0; i < vertexCount; ++i)
      {
        Vector v;
        file >> v.x >> v.y >> v.z;
        vertices.push_back(v);

        if (isRGB)
        {
          int r, g, b;
          file >> r >> g >> b;
          colors.push_back({uint8_t(r), uint8_t(g), uint8_t(b)});
        }
        else
          colors.push_back({100, 100, 100});
        
        // only for sponza
        std::string sss; for(int j=0; j<11; j++) file >> sss;
      }

      for (int i = 0; i < faceCount; ++i)
      {
        int count;
        file >> count;
        if (count != 3) // only triangles supported
        {
          std::cerr << "Warning: only triangles are supported" << std::endl;
          std::getline(file, token);
          continue;
        }
        int v1, v2, v3;
        file >> v1 >> v2 >> v3;
        // RGB color{uint8_t(rand() % 200), uint8_t(rand() % 200), uint8_t(rand() % 200)};
        if (colors.empty())
          config.triangles.emplace_back(Triangle{
              vertices[v1], vertices[v2], vertices[v3], {40, 200, 40}, {50, 50, 200}, {0, 0, 0}});
        else
          config.triangles.emplace_back(Triangle{vertices[v1], vertices[v2], vertices[v3],
                                                 colors[v1], colors[v2], colors[v3]});
        config.triangles[config.triangles.size()-1].normal = getNormalVector(config.triangles[config.triangles.size()-1]);
      }
    }
    // else
    //  throw std::invalid_argument("Unknown token '" + token + "'");
    if (!file.good())
      throw std::invalid_argument("Invalid config file format.");
  }
  return config;
}